

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.h
# Opt level: O0

void __thiscall MeCab::ChunkFreeList<char>::~ChunkFreeList(ChunkFreeList<char> *this)

{
  pointer ppVar1;
  pointer ppVar2;
  reference pvVar3;
  vector<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
  *in_RDI;
  
  (in_RDI->
  super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__ChunkFreeList_002481b8;
  in_RDI[1].
  super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    ppVar1 = in_RDI[1].
             super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    ppVar2 = (pointer)std::
                      vector<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
                      ::size((vector<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
                              *)&(in_RDI->
                                 super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish);
    if (ppVar2 <= ppVar1) break;
    pvVar3 = std::
             vector<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
             ::operator[]((vector<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
                           *)&(in_RDI->
                              super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish,
                          (size_type)
                          in_RDI[1].
                          super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (pvVar3->second != (char *)0x0) {
      operator_delete__(pvVar3->second);
    }
    in_RDI[1].
    super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)&(in_RDI[1].
                           super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage)->first + 1);
  }
  std::vector<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
  ::~vector(in_RDI);
  return;
}

Assistant:

virtual ~ChunkFreeList() {
    for (li_ = 0; li_ < freelist_.size(); li_++)
      delete [] freelist_[li_].second;
  }